

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

int toknext(tokcxdef *ctx)

{
  toksdef *ptVar1;
  ushort uVar2;
  ushort *puVar3;
  toktdef *ptVar4;
  bool bVar5;
  short sVar6;
  short sVar7;
  char *pcVar8;
  ushort uVar9;
  int iVar10;
  int iVar11;
  ushort **ppuVar12;
  long lVar13;
  __int32_t **pp_Var14;
  char *pcVar15;
  tokdfdef *ptVar16;
  size_t sVar17;
  tokscdef *ptVar18;
  byte *pbVar19;
  long lVar20;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  byte *pbVar25;
  errcxdef *ctx_00;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  char *pcVar29;
  toktdef **pptVar30;
  byte *pbVar31;
  byte bVar32;
  int iVar33;
  uint uVar34;
  size_t sVar35;
  uint uVar36;
  bool bVar37;
  char mysym [39];
  
  uVar26 = ctx->tokcxflg;
  if ((uVar26 & 8) != 0) {
    (ctx->tokcxcur).toktyp = 0x35;
    ctx->tokcxflg = uVar26 & 0xfffffff7;
    return 0x35;
  }
  pcVar29 = ctx->tokcxptr;
  uVar26 = (uint)ctx->tokcxlen;
LAB_001153db:
  do {
    pcVar15 = pcVar29;
    uVar34 = uVar26;
    if (uVar26 == 0) {
      lVar13 = (long)ctx->tokcxmlvl;
      if (lVar13 == 0) {
        iVar10 = tokgetlin(ctx,1);
        if (iVar10 != 0) {
          (ctx->tokcxcur).toktyp = 1;
          sVar35 = 0;
          goto LAB_00115551;
        }
        pcVar29 = ctx->tokcxptr;
        uVar26 = (uint)ctx->tokcxlen;
        pcVar15 = pcVar29;
        uVar34 = uVar26;
      }
      else {
        ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
        pcVar29 = ctx->tokcxmsav[lVar13 + -1];
        uVar26 = (uint)ctx->tokcxmsvl[lVar13 + -1];
        pcVar15 = pcVar29;
        uVar34 = uVar26;
      }
    }
    while( true ) {
      sVar17 = (size_t)uVar26;
      if (uVar26 == 0) break;
      bVar32 = *pcVar29;
      if (((long)(char)bVar32 < 0) ||
         (ppuVar12 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar12 + (long)(char)bVar32 * 2 + 1) & 0x20) == 0)) {
        if ((int)uVar26 < 2) goto LAB_001154ff;
        pcVar15 = pcVar29;
        if (bVar32 != 0x2f) goto LAB_00115575;
        if (pcVar29[1] == 0x2f) goto LAB_001154fc;
        if (pcVar29[1] == 0x2a) goto LAB_00115487;
        goto LAB_00115575;
      }
      pcVar29 = pcVar29 + 1;
      uVar26 = uVar26 - 1;
    }
    pcVar29 = pcVar15 + uVar34;
LAB_001154fc:
    sVar17 = 0;
LAB_001154ff:
    uVar26 = 0;
    pcVar15 = pcVar29;
  } while ((int)sVar17 == 0);
LAB_00115575:
  ppuVar12 = __ctype_b_loc();
  pcVar24 = (ctx->tokcxcur).toknam;
LAB_0011558e:
  while( true ) {
    uVar26 = (uint)sVar17;
    uVar23 = sVar17 & 0xffffffff;
    puVar3 = *ppuVar12;
    bVar32 = *pcVar15;
    if ((((puVar3[bVar32] >> 10 & 1) == 0) && (bVar32 != 0x5f)) && (bVar32 != 0x24)) break;
    uVar36 = 0;
    for (uVar27 = 0; uVar26 != (uint)uVar27; uVar27 = uVar27 + 1) {
      bVar32 = pcVar15[uVar27];
      if ((((bVar32 != 0x5f) && (((*ppuVar12)[bVar32] & 0xc00) == 0)) && (bVar32 != 0x24)) ||
         (0x26 < (uint)uVar27)) {
        (ctx->tokcxcur).toknam[uVar27] = '\0';
        pcVar29 = pcVar15 + uVar27;
        bVar32 = pcVar15[uVar27];
        sVar35 = uVar23 - uVar27;
        if (((((*ppuVar12)[bVar32] & 0xc00) != 0) || (bVar32 == 0x24)) || (bVar32 == 0x5f)) {
          uVar22 = sVar35 & 0xffffffff;
          while( true ) {
            iVar10 = (int)uVar22;
            uVar26 = iVar10 - 1;
            uVar22 = (ulong)uVar26;
            pcVar8 = pcVar15 + uVar23;
            if ((iVar10 == 0) ||
               (((bVar32 = *pcVar29, ((*ppuVar12)[bVar32] & 0xc00) == 0 && (bVar32 != 0x5f)) &&
                (pcVar8 = pcVar29, bVar32 != 0x24)))) break;
            pcVar29 = pcVar29 + 1;
            sVar35 = (size_t)uVar26;
          }
          pcVar29 = pcVar8;
          pcVar15 = errstr(ctx->tokcxerr,pcVar24,(ctx->tokcxcur).toklen);
          ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar15;
          ctx->tokcxerr->errcxptr->erraac = 1;
          errlogn(ctx->tokcxerr,0x66,"TADS");
        }
        goto LAB_001156d8;
      }
      if ((((*ppuVar12)[bVar32] >> 8 & 1) != 0) && ((ctx->tokcxflg & 2) != 0)) {
        pp_Var14 = __ctype_tolower_loc();
        bVar32 = *(byte *)(*pp_Var14 + bVar32);
      }
      uVar36 = (uint)(byte)((char)uVar36 + bVar32);
      (ctx->tokcxcur).toknam[uVar27] = bVar32;
    }
    (ctx->tokcxcur).toknam[uVar27] = '\0';
    pcVar29 = pcVar15 + uVar27;
    sVar35 = 0;
    uVar27 = sVar17 & 0xffffffff;
LAB_001156d8:
    iVar10 = (int)uVar27;
    (ctx->tokcxcur).toklen = iVar10;
    (ctx->tokcxcur).tokhash = uVar36;
    if (iVar10 == 9) {
      pcVar15 = "__defined";
      if ((ctx->tokcxflg & 2) == 0) {
        pcVar15 = "__DEFINED";
      }
      iVar11 = bcmp(pcVar24,pcVar15,9);
      iVar33 = (int)sVar35;
      if (((2 < iVar33) && (iVar11 == 0)) && (*pcVar29 == 0x28)) {
        bVar32 = pcVar29[1];
        uVar2 = (*ppuVar12)[bVar32];
        if (((((uVar2 & 0xc00) != 0) || (bVar32 == 0x5f)) || (bVar32 == 0x24)) &&
           ((uVar2 >> 0xb & 1) == 0)) {
          pbVar25 = (byte *)(pcVar29 + 1);
          pcVar29 = pcVar29 + 2;
          iVar10 = 0;
          goto LAB_00115ddb;
        }
      }
    }
    ptVar16 = tok_find_define(ctx,pcVar24,iVar10);
    if (ptVar16 == (tokdfdef *)0x0) {
      pptVar30 = &ctx->tokcxstab;
      ptVar1 = &(ctx->tokcxcur).toksym;
      goto LAB_00115951;
    }
    if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00115f04;
    ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar29;
    ctx->tokcxmsvl[ctx->tokcxmlvl] = (ushort)sVar35;
    ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
    pcVar15 = ptVar16->expan;
    sVar17 = (size_t)(uint)ptVar16->explen;
  }
  if ((puVar3[bVar32] >> 0xb & 1) != 0) {
    if (bVar32 != 0x30) {
      pcVar29 = pcVar15 + uVar23;
      sVar35 = 0;
      lVar13 = 0;
      uVar23 = sVar17 & 0xffffffff;
      goto LAB_00115e5e;
    }
    pcVar24 = pcVar15 + 1;
    uVar34 = uVar26 - 1;
    if ((uVar34 != 0) && ((byte)(*pcVar24 | 0x20U) == 0x78)) {
      uVar23 = (ulong)(uVar26 - 2);
      pcVar29 = pcVar15 + uVar23 + 2;
      pcVar15 = pcVar15 + 2;
      sVar35 = 0;
      lVar13 = 0;
      goto LAB_00115a1a;
    }
    pcVar29 = pcVar24 + uVar34;
    sVar35 = 0;
    lVar13 = 0;
    goto LAB_00115eac;
  }
  if ((bVar32 == 0x27) || (bVar32 == 0x22)) {
    pbVar25 = (byte *)(pcVar15 + 1);
    bVar37 = bVar32 == 0x22;
    if ((!bVar37) || ((int)uVar26 < 3)) {
      iVar10 = (bVar32 != 0x22) + 0x35;
LAB_00115ad1:
      uVar26 = uVar26 - 1;
      (ctx->tokcxcur).toktyp = iVar10;
      uVar9 = (*ctx->tokcxsst)(ctx->tokcxscx);
      (ctx->tokcxcur).tokofs = uVar9;
      bVar5 = false;
      pbVar31 = pbVar25;
      goto LAB_00115afa;
    }
    bVar32 = 0x22;
    if ((*pbVar25 != 0x3c) || (pcVar15[2] != 0x3c)) {
      bVar37 = true;
      iVar10 = 0x35;
      goto LAB_00115ad1;
    }
    if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00115f04;
    ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar15 + 3;
    ctx->tokcxmsvl[ctx->tokcxmlvl] = (short)sVar17 - 3;
    ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
    pcVar15 = tokmac1s;
    sVar17 = strlen(tokmac1s);
    *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg | 1;
    goto LAB_0011558e;
  }
  if (((((int)uVar26 < 2) || (bVar32 != 0x3e)) || (pcVar15[1] != 0x3e)) ||
     ((ctx->tokcxflg & 1U) == 0)) {
    ptVar18 = (tokscdef *)(ctx->tokcxsc + ctx->tokcxinx[bVar32]);
    goto LAB_00115a7a;
  }
  ctx->tokcxflg = ctx->tokcxflg & 0xfffffffe;
  if ((long)ctx->tokcxmlvl < 0x14) {
    ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar15 + 2;
    ctx->tokcxmsvl[ctx->tokcxmlvl] = (short)sVar17 - 2;
    iVar10 = ctx->tokcxmlvl;
    ctx->tokcxmlvl = iVar10 + 1;
    if (pcVar15[2] == 0x22) {
      ctx->tokcxmsav[iVar10] = ctx->tokcxmsav[iVar10] + 1;
      ctx->tokcxmsvl[(long)ctx->tokcxmlvl + -1] = ctx->tokcxmsvl[(long)ctx->tokcxmlvl + -1] - 1;
      uVar26 = ctx->tokcxflg & 0xffffffef;
      pcVar15 = tokmac3;
    }
    else {
      uVar26 = ctx->tokcxflg | 0x10;
      pcVar15 = tokmac2;
    }
    ctx->tokcxflg = uVar26;
    sVar17 = strlen(pcVar15);
    goto LAB_0011558e;
  }
LAB_00115f04:
  ctx_00 = ctx->tokcxerr;
  iVar10 = 0x78;
LAB_00115f10:
  errsigf(ctx_00,"TADS",iVar10);
LAB_00115e5e:
  uVar34 = (uint)sVar17;
  iVar10 = (int)uVar23;
  uVar26 = iVar10 - 1;
  uVar23 = (ulong)uVar26;
  if (iVar10 == 0) goto LAB_00115eee;
  if ((*(byte *)((long)puVar3 + (ulong)(byte)*pcVar15 * 2 + 1) & 8) == 0) goto LAB_00115ee0;
  lVar13 = lVar13 * 10 + (long)*pcVar15 + -0x30;
  pcVar15 = pcVar15 + 1;
  sVar17 = (size_t)uVar26;
  goto LAB_00115e5e;
LAB_00115eac:
  if (uVar34 == 0) goto LAB_00115eee;
  bVar32 = *pcVar24;
  if ((0xfd < (byte)(bVar32 - 0x3a)) || ((puVar3[bVar32] & 0x800) == 0)) {
    sVar35 = (size_t)uVar34;
    pcVar29 = pcVar24;
    goto LAB_00115eee;
  }
  lVar13 = (long)(char)bVar32 + lVar13 * 8 + -0x30;
  pcVar24 = pcVar24 + 1;
  uVar34 = uVar34 - 1;
  goto LAB_00115eac;
LAB_00115a1a:
  uVar34 = (uint)uVar23;
  if (uVar34 == 0) goto LAB_00115eee;
  bVar32 = *pcVar15;
  uVar23 = (ulong)bVar32;
  if ((*(byte *)((long)puVar3 + uVar23 * 2 + 1) & 8) == 0) {
    if ((byte)(bVar32 + 0x9f) < 6) {
      lVar20 = uVar23 - 0x57;
    }
    else {
      if (5 < (byte)(bVar32 + 0xbf)) goto LAB_00115ee0;
      lVar20 = uVar23 - 0x37;
    }
  }
  else {
    lVar20 = (long)(char)bVar32 + -0x30;
  }
  lVar13 = lVar13 * 0x10 + lVar20;
  pcVar15 = pcVar15 + 1;
  uVar23 = (ulong)(uVar34 - 1);
  goto LAB_00115a1a;
LAB_00115ee0:
  sVar35 = (size_t)uVar34;
  pcVar29 = pcVar15;
LAB_00115eee:
  (ctx->tokcxcur).tokval = lVar13;
  (ctx->tokcxcur).toktyp = 0x37;
  goto LAB_00115551;
LAB_00115afa:
  lVar13 = 0;
  uVar34 = uVar26;
  do {
    sVar35 = (size_t)uVar34;
    uVar28 = (uint)lVar13;
    uVar2 = (ushort)lVar13;
    sVar6 = (short)pbVar25;
    sVar7 = (short)pbVar31;
    if ((int)uVar34 < 2) {
      if (uVar26 == uVar28) {
        (*ctx->tokcxsad)(ctx->tokcxscx,(char *)pbVar31,(sVar6 - sVar7) + uVar2);
        lVar20 = (long)ctx->tokcxmlvl;
        if (lVar20 == 0) {
          (*ctx->tokcxsad)(ctx->tokcxscx," ",1);
          uVar26 = 0;
          pbVar25 = pbVar25 + lVar13;
        }
        else {
          ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
          uVar26 = (uint)ctx->tokcxmsvl[lVar20 + -1];
          pbVar25 = (byte *)ctx->tokcxmsav[lVar20 + -1];
        }
        break;
      }
      bVar21 = pbVar25[lVar13];
    }
    else {
      bVar21 = pbVar25[lVar13];
      if (bVar21 == 0x5c) goto LAB_00115b59;
    }
    if ((bVar21 == bVar32) ||
       (((bVar21 == 0x3c && !(bool)(bVar37 ^ 1) && (1 < (int)uVar34)) &&
        ((pbVar25[lVar13 + 1] == 0x3c && ((ctx->tokcxflg & 1) == 0)))))) {
      (*ctx->tokcxsad)(ctx->tokcxscx,(char *)pbVar31,(sVar6 - sVar7) + uVar2);
      (*ctx->tokcxsend)(ctx->tokcxscx);
      if (pbVar25[lVar13] == bVar32) {
        pcVar29 = (char *)(pbVar25 + lVar13 + 1);
        if ((ctx->tokcxflg & 0x11U) == 0x10) {
          ctx->tokcxflg = ctx->tokcxflg & 0xffffffee;
          if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00115f04;
          ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar29;
          ctx->tokcxmsvl[ctx->tokcxmlvl] = ~uVar2 + (short)uVar26;
          ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
          pcVar29 = tokmac4;
          sVar35 = strlen(tokmac4);
        }
        else {
          sVar35 = (size_t)((uVar26 - 1) - uVar28);
        }
        goto LAB_00115551;
      }
      if (pbVar25[lVar13] == 0x3c) {
        if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00115f04;
        ctx->tokcxmsav[ctx->tokcxmlvl] = (char *)(pbVar25 + lVar13 + 2);
        ctx->tokcxmsvl[ctx->tokcxmlvl] = ((short)uVar26 - uVar2) - 2;
        ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
        pcVar29 = tokmac1;
        sVar35 = strlen(tokmac1);
        uVar26 = ctx->tokcxflg;
        ctx->tokcxflg = uVar26 | 1;
        if ((uVar26 & 0x10) == 0) {
          ctx->tokcxflg = uVar26 | 9;
          (ctx->tokcxcur).toktyp = 0x32;
        }
      }
      else {
        pcVar29 = (char *)(pbVar25 + lVar13);
      }
      goto LAB_00115551;
    }
    uVar34 = uVar34 - 1;
    lVar13 = lVar13 + 1;
  } while( true );
LAB_00115ca4:
  pbVar31 = pbVar25;
  if (uVar26 == 0) {
    iVar10 = tokgetlin(ctx,0);
    if (iVar10 != 0) {
      ctx_00 = ctx->tokcxerr;
      iVar10 = 0x65;
      goto LAB_00115f10;
    }
    pbVar31 = (byte *)ctx->tokcxptr;
    uVar2 = ctx->tokcxlen;
    if ((uVar2 != 0 && !bVar5) && ((*pbVar31 == 0x7d || (bVar5 = false, *pbVar31 == 0x3b)))) {
      errlogf(ctx->tokcxerr,"TADS",0x159);
      bVar5 = true;
    }
    pbVar19 = pbVar31 + (uint)uVar2;
    uVar26 = (uint)uVar2;
    while (((pbVar25 = pbVar19, uVar26 != 0 && (pbVar25 = pbVar31, -1 < (long)(char)*pbVar31)) &&
           ((*(byte *)((long)*ppuVar12 + (long)(char)*pbVar31 * 2 + 1) & 0x20) != 0))) {
      pbVar31 = pbVar31 + 1;
      uVar26 = uVar26 - 1;
    }
    goto LAB_00115ca4;
  }
  goto LAB_00115afa;
LAB_00115b59:
  if ((pbVar25[lVar13 + 1] == 0x27) || (pbVar19 = pbVar31, pbVar25[lVar13 + 1] == 0x22)) {
    pbVar19 = pbVar25 + lVar13 + 1;
    (*ctx->tokcxsad)(ctx->tokcxscx,(char *)pbVar31,(sVar6 - sVar7) + uVar2);
  }
  pbVar25 = pbVar25 + lVar13 + 2;
  uVar26 = (uVar26 - uVar28) - 2;
  pbVar31 = pbVar19;
  goto LAB_00115afa;
  while ((iVar10 = ptVar18->toksclen, (int)uVar26 < iVar10 ||
         ((iVar10 != 1 &&
          ((ptVar18->tokscstr[1] != pcVar15[1] ||
           ((iVar10 != 2 && (ptVar18->tokscstr[2] != pcVar15[2]))))))))) {
LAB_00115a7a:
    ptVar18 = ptVar18->tokscnxt;
    if (ptVar18 == (tokscdef *)0x0) {
      ctx_00 = ctx->tokcxerr;
      iVar10 = 100;
      goto LAB_00115f10;
    }
  }
  (ctx->tokcxcur).toktyp = ptVar18->toksctyp;
  pcVar29 = pcVar15 + ptVar18->toksclen;
  sVar35 = (size_t)(uVar26 - ptVar18->toksclen);
  goto LAB_00115551;
LAB_00115ddb:
  if (iVar33 + -1 == iVar10) goto LAB_00115f32;
  uVar23 = (ulong)(byte)pcVar29[-1];
  if (uVar23 == 0x29) {
    sVar35 = (size_t)((iVar33 - iVar10) - 2);
    pcVar15 = tok_casefold_defsym(ctx,mysym,(char *)pbVar25,iVar10);
    (ctx->tokcxcur).toktyp = 0x37;
    ptVar16 = tok_find_define(ctx,pcVar15,iVar10);
    (ctx->tokcxcur).tokval = (ulong)(ptVar16 != (tokdfdef *)0x0);
    goto LAB_00115551;
  }
  if (((((*ppuVar12)[uVar23] & 0xc00) == 0) && (uVar23 != 0x5f)) && (pcVar29[-1] != 0x24))
  goto LAB_00115f32;
  iVar10 = iVar10 + 1;
  pcVar29 = pcVar29 + 1;
  goto LAB_00115ddb;
LAB_00115f32:
  ctx_00 = ctx->tokcxerr;
  iVar10 = 0x79;
  goto LAB_00115f10;
LAB_00115487:
  uVar26 = (uint)sVar17;
  if ((((int)uVar26 < 2) || (*pcVar29 != 0x2a)) || (pcVar29[1] != 0x2f)) {
    pcVar29 = pcVar29 + (uVar26 != 0);
    sVar17 = (size_t)(uVar26 - 1);
    if (uVar26 < 2) {
      lVar13 = (long)ctx->tokcxmlvl;
      if (lVar13 == 0) {
        iVar10 = tokgetlin(ctx,0);
        if (iVar10 != 0) {
          ctx->tokcxptr = pcVar29;
          (ctx->tokcxcur).toktyp = 1;
          sVar35 = 0;
          goto LAB_00115551;
        }
        pcVar29 = ctx->tokcxptr;
        sVar17 = (size_t)ctx->tokcxlen;
      }
      else {
        ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
        pcVar29 = ctx->tokcxmsav[lVar13 + -1];
        sVar17 = (size_t)ctx->tokcxmsvl[lVar13 + -1];
      }
    }
    goto LAB_00115487;
  }
  pcVar29 = pcVar29 + 2;
  uVar26 = uVar26 - 2;
  goto LAB_001153db;
  while( true ) {
    iVar11 = (*ptVar4->toktfsea)(ptVar4,pcVar24,iVar10,uVar36,ptVar1);
    pptVar30 = &ptVar4->toktnxt;
    if (iVar11 != 0) break;
LAB_00115951:
    ptVar4 = *pptVar30;
    if (ptVar4 == (toktdef *)0x0) {
      (ctx->tokcxcur).toktyp = 0x38;
      (ctx->tokcxcur).toksym.tokstyp = '\0';
      goto LAB_00115551;
    }
  }
  if (ptVar1->tokstyp == '\v') {
    (ctx->tokcxcur).toktyp = (uint)(ctx->tokcxcur).toksym.toksval;
  }
  else {
    (ctx->tokcxcur).toktyp = 0x38;
  }
LAB_00115551:
  ctx->tokcxptr = pcVar29;
  ctx->tokcxlen = (ushort)sVar35;
  return (ctx->tokcxcur).toktyp;
}

Assistant:

int toknext(tokcxdef *ctx)
{
    char   *p;
    tokdef *tok = &ctx->tokcxcur;
    int     len;

    /* 
     *   Check for the special case that we pushed an open paren prior to
     *   a string containing an embedded expression.  If this is the case,
     *   immediately return the string we previously parsed. 
     */
    if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_PRE) != 0)
    {
        /* 
         *   convert the token to a string - note that the offset
         *   information for the string is already in the current token
         *   structure, since we set everything up for it on the previous
         *   call where we actually parsed the beginning of the string 
         */
        tok->toktyp = TOKTDSTRING;

        /* clear the special flag - we've now consumed the pushed string */
        ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_PRE;

        /* immediately return the string */
        return tok->toktyp;
    }

    /* set up at the current scanning position */
    p = ctx->tokcxptr;
    len = ctx->tokcxlen;

    /* scan off whitespace and comments until we find something */
    do
    {
    skipblanks:
        /* if there's nothing on this line, get the next one */
        if (len == 0)
        {
            /* if we're in a macro expansion, continue after it */
            if (ctx->tokcxmlvl)
            {
                ctx->tokcxmlvl--;
                p = ctx->tokcxmsav[ctx->tokcxmlvl];
                len = ctx->tokcxmsvl[ctx->tokcxmlvl];
            }
            else
            {
                if (tokgetlin(ctx, TRUE))
                {
                    tok->toktyp = TOKTEOF;
                    goto done;
                }
                p = ctx->tokcxptr;
                len = ctx->tokcxlen;
            }
        }
        while (len && t_isspace(*p)) ++p, --len;     /* scan off whitespace */
        
        /* check for comments, and remove if present */
        if (len >= 2 && *p == '/' && *(p+1) == '/')
            len = 0;
        else if (len >= 2 && *p == '/' && *(p+1) == '*')
        {
            while (len < 2 || *p != '*' || *(p+1) != '/')
            {
                if (len != 0)
                    ++p, --len;

                if (len == 0)
                {
                    if (ctx->tokcxmlvl != 0)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                    {
                        if (tokgetlin(ctx, FALSE))
                        {
                            ctx->tokcxptr = p;
                            tok->toktyp = TOKTEOF;
                            goto done;
                        }
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;
                    }
                }
            }
            p += 2;
            len -= 2;
            goto skipblanks;
        }
    } while (len == 0);
    
nexttoken:
    if (isalpha((uchar)*p) || *p == '_' || *p == '$')
    {
        int       l;
        int       hash;
        char     *q;
        toktdef  *tab;
        int       found = FALSE;
        uchar     thischar;
        tokdfdef *df;
        
        for (hash = 0, l = 0, q = tok->toknam ;
             len != 0 && TOKISSYM(*p) && l < TOKNAMMAX ;
             (thischar = ((isupper((uchar)*p)
                           && (ctx->tokcxflg & TOKCXCASEFOLD))
                          ? tolower((uchar)*p) : *p)),
             (hash = ((hash + thischar) & (TOKHASHSIZE - 1))),
             (*q++ = thischar), ++p, --len, ++l) ;
        *q = '\0';
        if (len != 0 && TOKISSYM(*p))
        {
            while (len != 0 && TOKISSYM(*p)) ++p, --len;
            errlog1(ctx->tokcxerr, ERR_TRUNC, ERRTSTR,
                    errstr(ctx->tokcxerr, tok->toknam, tok->toklen));
        }
        tok->toklen = l;
        tok->tokhash = hash;

        /*
         *   check for the special defined() preprocessor operator 
         */
        if (l == 9 && !memcmp(tok->toknam,
                              ((ctx->tokcxflg & TOKCXCASEFOLD)
                               ? "__defined" : "__DEFINED"),
                              (size_t)9)
            && len > 2 && *p == '(' && TOKISSYM(*(p+1))
            && !isdigit((uchar)*(p+1)))
        {
            int symlen;
            char mysym[TOKNAMMAX];
            
            /* find the matching ')', allowing only symbolic characters */
            ++p, --len;
            for (symlen = 0, q = p ; len && *p != ')' && TOKISSYM(*p) ;
                 ++p, --len, ++symlen) ;

            /* make sure we found the closing paren */
            if (!len || *p != ')')
                errsig(ctx->tokcxerr, ERR_BADISDEF);
            ++p, --len;

            /* if we're folding case, convert the symbol to lower case */
            q = tok_casefold_defsym(ctx, mysym, q, symlen);

            /* check to see if it's defined */
            tok->toktyp = TOKTNUMBER;
            tok->tokval = (tok_find_define(ctx, q, symlen) != 0);
            goto done;
        }

        /* substitute the preprocessor #define, if any */
        if ((df = tok_find_define(ctx, tok->toknam, l)) != 0)
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
            ctx->tokcxmlvl++;

            /* point to the token's expansion and keep going */
            p = df->expan;
            len = df->explen;
            goto nexttoken;
        }
        
        /* look up in symbol table(s), if any */
        for (tab = ctx->tokcxstab ; tab ; tab = tab->toktnxt)
        {
            if ((found = (*tab->toktfsea)(tab, tok->toknam, l, hash,
                                          &tok->toksym)) != 0)
                break;
        }
        
        if (found && tok->toksym.tokstyp == TOKSTKW)
            tok->toktyp = tok->toksym.toksval;
        else
        {
            tok->toktyp = TOKTSYMBOL;
            if (!found) tok->toksym.tokstyp = TOKSTUNK;
        }
        goto done;
    }
    else if (isdigit((uchar)*p))
    {
        long acc = 0;
        
        /* check for octal/hex */
        if (*p == '0')
        {
            ++p, --len;
            if (len && (*p == 'x' || *p == 'X'))
            {
                /* hex */
                ++p, --len;
                while (len && TOKISHEX(*p))
                {
                    acc = (acc << 4) + TOKHEX2INT(*p);
                    ++p, --len;
                }
            }
            else
            {
                /* octal */
                while (len && TOKISOCT(*p))
                {
                    acc = (acc << 3) + TOKOCT2INT(*p);
                    ++p, --len;
                }
            }
        }
        else
        {
            /* decimal */
            while (len && isdigit((uchar)*p))
            {
                acc = (acc << 1) + (acc << 3) + TOKDEC2INT(*p);
                ++p, --len;
            }
        }
        tok->tokval = acc;
        tok->toktyp = TOKTNUMBER;
        goto done;
    }
    else if (*p == '"' || *p == '\'')
    {
        char  delim;                 /* closing delimiter we're looking for */
        char *strstart;                       /* pointer to start of string */
        int   warned;
        
        delim = *p;
        --len;
        strstart = ++p;

        if (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* 
             *   read from the special "<<" expansion string - use the
             *   version for a "<<" at the very beginning of the string 
             */
            p = tokmac1s;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;
            goto nexttoken;
        }
        tok->toktyp = (delim == '"' ? TOKTDSTRING : TOKTSSTRING);
        
        tok->tokofs = (*ctx->tokcxsst)(ctx->tokcxscx);  /* start the string */
        for (warned = FALSE ;; )
        {
            if (len >= 2 && *p == '\\')
            {
                if (*(p+1) == '"' || *(p+1) == '\'')
                {
                    (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                     (ushort)(p - strstart));
                    strstart = p + 1;
                }
                p += 2;
                len -= 2;
            }
            else if (len == 0 || *p == delim ||
                     (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<'
                      && !(ctx->tokcxflg & TOKCXFINMAC)))
            {
                (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                 (ushort)(p - strstart));
                if (len == 0)
                {
                    if (ctx->tokcxmlvl)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                        (*ctx->tokcxsad)(ctx->tokcxscx, " ", (ushort)1);
                    
                    while (len == 0)
                    {
                        if (tokgetlin(ctx, FALSE))
                            errsig(ctx->tokcxerr, ERR_STREOF);
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;

                        /* warn if it looks like the end of an object */
                        if (!warned && len && (*p == ';' || *p == '}'))
                        {
                            errlog(ctx->tokcxerr, ERR_STREND);
                            warned = TRUE;     /* warn only once per string */
                        }

                        /* scan past whitespace at start of line */
                        while (len && t_isspace(*p)) ++p, --len;
                    }
                    strstart = p;
                }
                else break;
            }
            else
                ++p, --len;
        }

        /* end the string */
        (*ctx->tokcxsend)(ctx->tokcxscx);

        /* check to see how it ended */
        if (len != 0 && *p == delim)
        {
            /* 
             *   We ended with the matching delimiter.  Move past the
             *   closing delimiter. 
             */
            ++p;
            --len;

            /*
             *   If we have a pending close paren we need to put in
             *   because of an embedded expression that occurred earlier
             *   in the string, parse the macro to provide the paren.  
             */
            if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT) != 0
                && !(ctx->tokcxflg & TOKCXFINMAC))
            {
                /* clear the flag */
                ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;

                /* push the current parsing position */
                if (ctx->tokcxmlvl >= TOKMACNEST)
                    errsig(ctx->tokcxerr, ERR_MACNEST);
                ctx->tokcxmsav[ctx->tokcxmlvl] = p;
                ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
                ctx->tokcxmlvl++;

                /* parse the macro */
                p = tokmac4;
                len = strlen(p);
            }
        }
        else if (len != 0 && *p == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* read from the "<<" expansion */
            p = tokmac1;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;

            /* 
             *   Set the special push-a-paren flag: we'll return an open
             *   paren now, so that we have an open paren before the
             *   string, and then on the next call to toknext() we'll
             *   immediately return the string we've already parsed here.
             *   This will ensure that everything in the string is
             *   properly grouped together as a single indivisible
             *   expression.
             *   
             *   Note that we only need to do this for the first embedded
             *   expression in a string.  Once we have a close paren
             *   pending, we don't need more open parens.  
             */
            if (!(ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT))
            {
                ctx->tokcxflg |= TOKCXF_EMBED_PAREN_PRE;
                tok->toktyp = TOKTLPAR;
            }
        }
        goto done;
    }
    else if (len >= 2 && *p == '>' && *(p+1) == '>'
             && (ctx->tokcxflg & TOKCXFINMAC) != 0)
    {
        /* skip the ">>" */
        ctx->tokcxflg &= ~TOKCXFINMAC;
        p += 2;
        len -= 2;

        /* save the current parsing position */
        if (ctx->tokcxmlvl >= TOKMACNEST)
            errsig(ctx->tokcxerr, ERR_MACNEST);
        ctx->tokcxmsav[ctx->tokcxmlvl] = p;
        ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
        ctx->tokcxmlvl++;

        if (*p == '"')
        {
            ++(ctx->tokcxmsav[ctx->tokcxmlvl - 1]);
            --(ctx->tokcxmsvl[ctx->tokcxmlvl - 1]);
            p = tokmac3;

            /* 
             *   we won't need an extra closing paren now, since tokmac3
             *   provides it 
             */
            ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;
        }
        else
        {
            /* 
             *   The string is continuing.  Set a flag to note that we
             *   need to provide a close paren after the end of the
             *   string, and parse the glue (tokmac2) that goes between
             *   the expression and the resumption of the string. 
             */
            ctx->tokcxflg |= TOKCXF_EMBED_PAREN_AFT;
            p = tokmac2;
        }

        len = strlen(p);
        goto nexttoken;
    }
    else
    {
        tokscdef *sc;
        
        for (sc = ctx->tokcxsc[ctx->tokcxinx[(uchar)*p]] ; sc ;
             sc = sc->tokscnxt)
        {
            if (toksceq(sc->tokscstr, p, sc->toksclen, len))
            {
                tok->toktyp = sc->toksctyp;
                p += sc->toksclen;
                len -= sc->toksclen;
                goto done;
            }
        }
        errsig(ctx->tokcxerr, ERR_INVTOK);
    }
    
done:
    ctx->tokcxptr = p;
    ctx->tokcxlen = len;
    return(tok->toktyp);
}